

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9PoPart(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Frame_t *pAbc_00;
  int iVar1;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint fVerbose;
  int iVar3;
  uint fOnlyCis;
  char *pcVar4;
  uint local_4c;
  uint local_48;
  Vec_Ptr_t *vPosEquivs;
  Abc_Frame_t *local_38;
  
  vPosEquivs = (Vec_Ptr_t *)0x0;
  local_4c = 0;
  local_38 = pAbc;
  Extra_UtilGetoptReset();
  fOnlyCis = 0;
  local_48 = 0;
  fVerbose = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while (iVar1 = Extra_UtilGetopt(argc,argv,"Simvh"), pAbc_00 = local_38,
              iVar3 = globalUtilOptind, iVar1 == 0x76) {
          fVerbose = fVerbose ^ 1;
        }
        if (iVar1 == -1) {
          if (local_38->pGia != (Gia_Man_t *)0x0) {
            pNew = Gia_ManFindPoPartition
                             (local_38->pGia,local_4c,fOnlyCis,local_48,fVerbose,&vPosEquivs);
            if (pNew != (Gia_Man_t *)0x0) {
              Abc_FrameUpdateGia(pAbc_00,pNew);
            }
            Abc_FrameReplacePoEquivs(pAbc_00,&vPosEquivs);
            return 0;
          }
          pcVar2 = "Abc_CommandAbc9PoPart(): There is no AIG.\n";
          iVar3 = -1;
          goto LAB_002585fd;
        }
        if (iVar1 != 0x6d) break;
        local_48 = local_48 ^ 1;
      }
      if (iVar1 != 0x69) break;
      fOnlyCis = fOnlyCis ^ 1;
    }
    if (iVar1 != 0x53) goto LAB_00258550;
    if (argc <= globalUtilOptind) break;
    local_4c = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if ((int)local_4c < 0) {
LAB_00258550:
      iVar3 = -2;
      Abc_Print(-2,"usage: &popart [-S num] [-imvh]\n");
      Abc_Print(-2,"\t         partitioning of POs into equivalence classes\n");
      Abc_Print(-2,"\t-S num : random seed to select the set of pivot nodes [default = %d]\n",
                (ulong)local_4c);
      Abc_Print(-2,"\t       : (if the seed is 0, the nodes with max fanout counts are used)\n");
      pcVar4 = "yes";
      pcVar2 = "yes";
      if (fOnlyCis == 0) {
        pcVar2 = "no";
      }
      Abc_Print(-2,"\t-i     : toggle allowing only CIs to be the pivots [default = %s]\n",pcVar2);
      pcVar2 = "yes";
      if (local_48 == 0) {
        pcVar2 = "no";
      }
      Abc_Print(-2,
                "\t-m     : toggle using the largest part as the current network [default = %s]\n",
                pcVar2);
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      pcVar2 = "\t-h     : print the command usage\n";
LAB_002585fd:
      Abc_Print(iVar3,pcVar2);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
  goto LAB_00258550;
}

Assistant:

int Abc_CommandAbc9PoPart( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManFindPoPartition( Gia_Man_t * p, int SelectShift, int fOnlyCis, int fSetLargest, int fVerbose, Vec_Ptr_t ** pvPosEquivs );
    Gia_Man_t * pTemp;
    Vec_Ptr_t * vPosEquivs = NULL;
    int c, SelectShift = 0, fOnlyCis = 0, fSetLargest = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Simvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            SelectShift = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( SelectShift < 0 )
                goto usage;
            break;
        case 'i':
            fOnlyCis ^= 1;
            break;
        case 'm':
            fSetLargest ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9PoPart(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Gia_ManFindPoPartition( pAbc->pGia, SelectShift, fOnlyCis, fSetLargest, fVerbose, &vPosEquivs );
    if ( pTemp )
        Abc_FrameUpdateGia( pAbc, pTemp );
    Abc_FrameReplacePoEquivs( pAbc, &vPosEquivs );
    return 0;

usage:
    Abc_Print( -2, "usage: &popart [-S num] [-imvh]\n" );
    Abc_Print( -2, "\t         partitioning of POs into equivalence classes\n" );
    Abc_Print( -2, "\t-S num : random seed to select the set of pivot nodes [default = %d]\n", SelectShift );
    Abc_Print( -2, "\t       : (if the seed is 0, the nodes with max fanout counts are used)\n" );
    Abc_Print( -2, "\t-i     : toggle allowing only CIs to be the pivots [default = %s]\n", fOnlyCis? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle using the largest part as the current network [default = %s]\n", fSetLargest? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}